

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

GLFWbool hasUsableInputMethodStyle(void)

{
  long lVar1;
  XIMStyles *styles;
  GLFWbool found;
  uint i;
  ushort *local_18;
  GLFWbool local_c;
  uint local_8;
  GLFWbool local_4;
  
  local_c = 0;
  local_18 = (ushort *)0x0;
  lVar1 = XGetIMValues(_glfw.x11.im,"queryInputStyle",&local_18,0);
  if (lVar1 == 0) {
    for (local_8 = 0; local_8 < *local_18; local_8 = local_8 + 1) {
      if (*(long *)(*(long *)(local_18 + 4) + (ulong)local_8 * 8) == 0x408) {
        local_c = 1;
        break;
      }
    }
    XFree(local_18);
    local_4 = local_c;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static GLFWbool hasUsableInputMethodStyle(void)
{
    unsigned int i;
    GLFWbool found = GLFW_FALSE;
    XIMStyles* styles = NULL;

    if (XGetIMValues(_glfw.x11.im, XNQueryInputStyle, &styles, NULL) != NULL)
        return GLFW_FALSE;

    for (i = 0;  i < styles->count_styles;  i++)
    {
        if (styles->supported_styles[i] == (XIMPreeditNothing | XIMStatusNothing))
        {
            found = GLFW_TRUE;
            break;
        }
    }

    XFree(styles);
    return found;
}